

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
::value_init<phmap::priv::(anonymous_namespace)::StringLike*>
          (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
           *this,size_type i,allocator_type *alloc,StringLike **args)

{
  allocator_type *paVar1;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
  *pbVar2;
  undefined8 uVar3;
  long lVar4;
  
  if (((ulong)this & 7) == 0) {
    lVar4 = i * 0x20;
    pbVar2 = this + lVar4 + 0x20;
    *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
      **)(pbVar2 + -0x10) = pbVar2;
    paVar1 = alloc + 0x10;
    if (*(allocator_type **)alloc == paVar1) {
      uVar3 = *(undefined8 *)(alloc + 0x18);
      *(undefined8 *)pbVar2 = *(undefined8 *)paVar1;
      *(undefined8 *)(pbVar2 + 8) = uVar3;
    }
    else {
      *(allocator_type **)(this + lVar4 + 0x10) = *(allocator_type **)alloc;
      *(undefined8 *)(this + lVar4 + 0x20) = *(undefined8 *)paVar1;
    }
    *(undefined8 *)(this + lVar4 + 0x18) = *(undefined8 *)(alloc + 8);
    *(allocator_type **)alloc = paVar1;
    *(undefined8 *)(alloc + 8) = 0;
    alloc[0x10] = (allocator_type)0x0;
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
        using C = typename std::remove_const<Char>::type;
        static_assert(
            std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
            "The argument must be a pointer to [const] [signed|unsigned] char");
        constexpr size_t alignment = Alignment();
        (void)alignment;
        assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
        return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
    }